

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  initializer_list<char> __l;
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  Classifier CVar6;
  reference pvVar7;
  Option *pOVar8;
  size_type sVar9;
  byte in_DL;
  App *in_RSI;
  size_type in_RDI;
  Classifier res;
  App *cm;
  size_type dotloc;
  string dummy2;
  string dummy1;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char __c;
  App *in_stack_fffffffffffffec0;
  App *this_00;
  size_type in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  App *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined5 in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  string *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff40;
  App *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab [2];
  undefined4 local_64;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  Classifier local_4;
  
  bVar1 = in_DL & 1;
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffec0,
                            (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (bVar2) {
    local_4 = POSITIONAL_MARK;
  }
  else {
    uVar3 = _valid_subcommand(in_stack_fffffffffffffed8,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                              SUB81(in_stack_fffffffffffffec8 >> 0x38,0));
    if ((bool)uVar3) {
      local_4 = SUBCOMMAND;
    }
    else {
      uVar4 = CLI::detail::split_long
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if ((bool)uVar4) {
        local_4 = LONG;
      }
      else {
        uVar5 = CLI::detail::split_short
                          ((string *)
                           CONCAT17(in_stack_ffffffffffffff0f,
                                    CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
                           in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if ((bool)uVar5) {
          pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffec0,
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          if (('/' < *pvVar7) &&
             (pvVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffec0,
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
             *pvVar7 < ':')) {
            local_ab[0]._M_dataplus._M_p._1_1_ = 0x2d;
            pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffec0,
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            local_ab[0]._M_dataplus._M_p._2_1_ = *pvVar7;
            local_ab[0]._3_8_ = (long)&local_ab[0]._M_dataplus._M_p + 1;
            local_ab[0]._11_8_ = 2;
            this_01 = local_ab;
            ::std::allocator<char>::allocator();
            __l._M_array._5_1_ = uVar5;
            __l._M_array._0_5_ = in_stack_fffffffffffffee8;
            __l._M_array._6_1_ = uVar4;
            __l._M_array._7_1_ = uVar3;
            __l._M_len = in_RDI;
            ::std::__cxx11::string::string(this_01,__l,(allocator<char> *)in_stack_fffffffffffffed8)
            ;
            pOVar8 = get_option_no_throw(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffec0);
            ::std::allocator<char>::~allocator((allocator<char> *)local_ab);
            if (pOVar8 == (Option *)0x0) {
              local_4 = NONE;
              goto LAB_001d1d31;
            }
          }
          local_4 = SHORT;
        }
        else if (((*(byte *)(in_RDI + 0x2db) & 1) == 0) ||
                (in_stack_fffffffffffffed7 =
                      CLI::detail::split_windows_style
                                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
                !(bool)in_stack_fffffffffffffed7)) {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffec0,
                                    (char *)CONCAT44(in_stack_fffffffffffffebc,
                                                     in_stack_fffffffffffffeb8));
          __c = (char)((uint)in_stack_fffffffffffffebc >> 0x18);
          this_00 = in_stack_fffffffffffffec0;
          if (((!bVar2) ||
              (bVar2 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x1d1bad), this_00 = in_stack_fffffffffffffec0, bVar2)) ||
             (*(long *)(in_RDI + 0x308) == 0)) {
            sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this_00,__c,0x1d1bf1);
            if (sVar9 != 0xffffffffffffffff) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffed8,
                     CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
              in_stack_fffffffffffffec0 =
                   _find_subcommand((App *)CONCAT44(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18),
                                    in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f,
                                    (bool)in_stack_ffffffffffffff0e);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
              if (in_stack_fffffffffffffec0 != (App *)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffed8,
                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       (size_type)in_stack_fffffffffffffec0);
                CVar6 = _recognize(in_RSI,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                                   (bool)in_stack_ffffffffffffffdf);
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffec0);
                this_00 = in_stack_fffffffffffffec0;
                if (CVar6 == SUBCOMMAND) {
                  local_4 = SUBCOMMAND;
                  goto LAB_001d1d31;
                }
              }
            }
            in_stack_fffffffffffffec0 = this_00;
            local_4 = NONE;
          }
          else {
            local_4 = SUBCOMMAND_TERMINATOR;
          }
        }
        else {
          local_4 = WINDOWS_STYLE;
        }
      }
    }
  }
LAB_001d1d31:
  local_64 = 1;
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec0);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec0);
  return local_4;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if(dummy1[0] >= '0' && dummy1[0] <= '9') {
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}